

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall diy::FileStorage::get(FileStorage *this,int i,MemoryBuffer *bb,size_t extra)

{
  int __fd;
  element_type *this_00;
  char *__file;
  reference __buf;
  FileStorage *this_01;
  long in_RDX;
  FileRecord *in_RDI;
  ssize_t n;
  int fh;
  FileRecord fr;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int __fd_00;
  undefined4 in_stack_ffffffffffffff9c;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_t local_48;
  int in_stack_ffffffffffffffc4;
  FileStorage *in_stack_ffffffffffffffc8;
  
  extract_file_record(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  get_logger();
  this_00 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x11adb7);
  spd::logger::debug<std::__cxx11::string>
            (this_00,"FileStorage::get(): {}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc0);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x11add7);
  std::vector<char,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  std::vector<char,_std::allocator<char>_>::resize(in_stack_ffffffffffffff90,(size_type)in_RDI);
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0x101000,0x180);
  __fd_00 = __fd;
  __buf = std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)(in_RDX + 0x10),0);
  this_01 = (FileStorage *)read(__fd,__buf,local_48);
  io::utils::close(__fd_00);
  remove_file(this_01,in_RDI);
  FileRecord::~FileRecord((FileRecord *)0x11aea4);
  return;
}

Assistant:

virtual void   get(int i, MemoryBuffer& bb, size_t extra) override
      {
        FileRecord fr = extract_file_record(i);

        get_logger()->debug("FileStorage::get(): {}", fr.name);

        bb.buffer.reserve(fr.size + extra);
        bb.buffer.resize(fr.size);
#if defined(_WIN32)
        int fh = -1;
        _sopen_s(&fh, fr.name.c_str(), _O_RDONLY | _O_BINARY, _SH_DENYNO, _S_IREAD);
        _read(fh, &bb.buffer[0], static_cast<unsigned int>(fr.size));
#else
        int fh = open(fr.name.c_str(), O_RDONLY | O_SYNC, 0600);
        auto n = read(fh, &bb.buffer[0], fr.size);
        DIY_UNUSED(n);
#endif
        io::utils::close(fh);
        remove_file(fr);
      }